

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::BeginCombo(char *label,char *preview_value,ImGuiComboFlags flags)

{
  float text_baseline_y;
  ImGuiNextWindowDataFlags IVar1;
  ImGuiWindow *this;
  ImVec2 pos;
  ImVec2 IVar2;
  ImVec2 p_min;
  ImVec2 p_max;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  ImGuiID id;
  ImU32 IVar6;
  ImU32 IVar7;
  ImDrawFlags IVar8;
  ImGuiContext *g;
  uint uVar9;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar10;
  float fVar11;
  bool hovered;
  bool held;
  ImRect bb;
  ImRect total_bb;
  bool local_e9;
  float local_e8;
  bool local_e1;
  ImRect local_e0;
  ImGuiID local_cc;
  undefined1 local_c8 [16];
  ImGuiNextWindowDataFlags local_ac;
  char *local_a8;
  ImVec2 local_a0;
  undefined1 local_98 [16];
  char *local_80;
  undefined1 local_78 [16];
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ImVec2 local_50;
  ImVec2 local_48;
  ImRect local_40;
  
  pIVar3 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  IVar1 = (pIVar3->NextWindowData).Flags;
  (pIVar3->NextWindowData).Flags = 0;
  if (this->SkipItems != false) {
    return false;
  }
  local_a8 = preview_value;
  id = ImGuiWindow::GetID(this,label,(char *)0x0);
  if ((~flags & 0x60U) == 0) {
    __assert_fail("(flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_widgets.cpp"
                  ,0x61f,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
  }
  local_e8 = 0.0;
  if ((flags & 0x20U) == 0) {
    local_e8 = GetFrameHeight();
  }
  IVar2 = CalcTextSize(label,(char *)0x0,true,-1.0);
  uStack_64 = 0;
  uStack_60 = 0;
  uStack_5c = 0;
  local_78._8_4_ = extraout_XMM0_Dc;
  local_78._0_4_ = IVar2.x;
  local_78._4_4_ = IVar2.y;
  local_78._12_4_ = extraout_XMM0_Dd;
  local_68 = local_e8;
  fVar10 = IVar2.x;
  fVar11 = IVar2.y;
  if ((flags & 0x40U) == 0) {
    local_68 = CalcItemWidth();
    uStack_64 = extraout_XMM0_Db;
    uStack_60 = extraout_XMM0_Dc_00;
    uStack_5c = extraout_XMM0_Dd_00;
    fVar10 = (float)local_78._0_4_;
    fVar11 = (float)local_78._4_4_;
  }
  text_baseline_y = (pIVar3->Style).FramePadding.y;
  local_e0.Min.x = (this->DC).CursorPos.x;
  local_e0.Min.y = (this->DC).CursorPos.y;
  local_e0.Max.x = local_68 + local_e0.Min.x;
  local_e0.Max.y = text_baseline_y + text_baseline_y + fVar11 + local_e0.Min.y;
  local_40.Max.x = 0.0;
  if (0.0 < fVar10) {
    local_40.Max.x = (pIVar3->Style).ItemInnerSpacing.x + fVar10;
  }
  local_40.Max.x = local_40.Max.x + local_e0.Max.x;
  local_40.Max.y = local_e0.Max.y + 0.0;
  local_ac = IVar1;
  local_80 = label;
  local_40.Min.x = local_e0.Min.x;
  local_40.Min.y = local_e0.Min.y;
  ItemSize(&local_40,text_baseline_y);
  bVar4 = ItemAdd(&local_40,id,&local_e0,0);
  if (!bVar4) {
    return false;
  }
  bVar4 = ButtonBehavior(&local_e0,id,&local_e9,&local_e1,0);
  local_cc = ImHashStr("##ComboPopup",0,id);
  bVar5 = IsPopupOpen(local_cc,0);
  if (bVar4) {
    bVar4 = true;
    if (bVar5) goto LAB_0016e921;
  }
  else {
    bVar4 = bVar5;
    if (pIVar3->NavActivateId != id || bVar5) goto LAB_0016e921;
  }
  OpenPopupEx(local_cc,0);
  bVar4 = true;
LAB_0016e921:
  IVar6 = GetColorU32(local_e9 + 7,1.0);
  local_c8 = ZEXT416((uint)local_e0.Min.x);
  local_98 = ZEXT416((uint)local_e0.Max.x);
  RenderNavHighlight(&local_e0,id,1);
  uVar9 = -(uint)((float)local_98._0_4_ - local_e8 <= (float)local_c8._0_4_);
  local_c8._0_4_ = uVar9 & local_c8._0_4_ | ~uVar9 & (uint)((float)local_98._0_4_ - local_e8);
  local_c8._4_4_ = local_98._4_4_ & local_c8._4_4_;
  local_c8._8_4_ = local_98._8_4_ & local_c8._8_4_;
  local_c8._12_4_ = local_98._12_4_ & local_c8._12_4_;
  if ((flags & 0x40U) == 0) {
    local_a0.y = local_e0.Max.y;
    local_a0.x = (float)local_c8._0_4_;
    IVar8 = 0xf0;
    if ((flags & 0x20U) == 0) {
      IVar8 = 0x50;
    }
    ImDrawList::AddRectFilled
              (this->DrawList,&local_e0.Min,&local_a0,IVar6,(pIVar3->Style).FrameRounding,IVar8);
  }
  if ((flags & 0x20U) == 0) {
    IVar6 = GetColorU32(((byte)(local_e9 | bVar4) & 1) + 0x15,1.0);
    IVar7 = GetColorU32(0,1.0);
    local_98._0_4_ = IVar7;
    local_a0.y = local_e0.Min.y;
    local_a0.x = (float)local_c8._0_4_;
    IVar8 = 0xa0;
    if (local_68 <= local_e8) {
      IVar8 = 0xf0;
    }
    ImDrawList::AddRectFilled
              (this->DrawList,&local_a0,&local_e0.Max,IVar6,(pIVar3->Style).FrameRounding,IVar8);
    if (((float)local_c8._0_4_ + local_e8) - (pIVar3->Style).FramePadding.x <= local_e0.Max.x) {
      fVar10 = (pIVar3->Style).FramePadding.y;
      IVar2.y = fVar10 + local_e0.Min.y;
      IVar2.x = fVar10 + (float)local_c8._0_4_;
      RenderArrow(this->DrawList,IVar2,local_98._0_4_,3,1.0);
    }
  }
  p_min.y = local_e0.Min.y;
  p_min.x = local_e0.Min.x;
  p_max.y = local_e0.Max.y;
  p_max.x = local_e0.Max.x;
  RenderFrameBorder(p_min,p_max,(pIVar3->Style).FrameRounding);
  if (local_a8 != (char *)0x0 && (char)((flags & 0x40U) >> 6) == '\0') {
    if (pIVar3->LogEnabled == true) {
      LogSetNextTextDecoration("{","}");
    }
    IVar2 = (pIVar3->Style).FramePadding;
    local_a0.x = IVar2.x + local_e0.Min.x;
    local_a0.y = IVar2.y + local_e0.Min.y;
    local_48.x = (float)local_c8._0_4_;
    local_48.y = local_e0.Max.y;
    local_50.x = 0.0;
    local_50.y = 0.0;
    RenderTextClipped(&local_a0,&local_48,local_a8,(char *)0x0,(ImVec2 *)0x0,&local_50,(ImRect *)0x0
                     );
  }
  if (0.0 < (float)local_78._0_4_) {
    pos.y = (pIVar3->Style).FramePadding.y + local_e0.Min.y;
    pos.x = (pIVar3->Style).ItemInnerSpacing.x + local_e0.Max.x;
    RenderText(pos,local_80,(char *)0x0,true);
  }
  if (bVar4 == false) {
    return false;
  }
  (pIVar3->NextWindowData).Flags = local_ac;
  bVar4 = BeginComboPopup(local_cc,&local_e0,flags);
  return bVar4;
}

Assistant:

bool ImGui::BeginCombo(const char* label, const char* preview_value, ImGuiComboFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    ImGuiNextWindowDataFlags backup_next_window_data_flags = g.NextWindowData.Flags;
    g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    IM_ASSERT((flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)); // Can't use both flags together

    const float arrow_size = (flags & ImGuiComboFlags_NoArrowButton) ? 0.0f : GetFrameHeight();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const float w = (flags & ImGuiComboFlags_NoPreview) ? arrow_size : CalcItemWidth();
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y * 2.0f));
    const ImRect total_bb(bb.Min, bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &bb))
        return false;

    // Open on click
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);
    const ImGuiID popup_id = ImHashStr("##ComboPopup", 0, id);
    bool popup_open = IsPopupOpen(popup_id, ImGuiPopupFlags_None);
    if ((pressed || g.NavActivateId == id) && !popup_open)
    {
        OpenPopupEx(popup_id, ImGuiPopupFlags_None);
        popup_open = true;
    }

    // Render shape
    const ImU32 frame_col = GetColorU32(hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    const float value_x2 = ImMax(bb.Min.x, bb.Max.x - arrow_size);
    RenderNavHighlight(bb, id);
    if (!(flags & ImGuiComboFlags_NoPreview))
        window->DrawList->AddRectFilled(bb.Min, ImVec2(value_x2, bb.Max.y), frame_col, style.FrameRounding, (flags & ImGuiComboFlags_NoArrowButton) ? ImDrawFlags_RoundCornersAll : ImDrawFlags_RoundCornersLeft);
    if (!(flags & ImGuiComboFlags_NoArrowButton))
    {
        ImU32 bg_col = GetColorU32((popup_open || hovered) ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
        ImU32 text_col = GetColorU32(ImGuiCol_Text);
        window->DrawList->AddRectFilled(ImVec2(value_x2, bb.Min.y), bb.Max, bg_col, style.FrameRounding, (w <= arrow_size) ? ImDrawFlags_RoundCornersAll : ImDrawFlags_RoundCornersRight);
        if (value_x2 + arrow_size - style.FramePadding.x <= bb.Max.x)
            RenderArrow(window->DrawList, ImVec2(value_x2 + style.FramePadding.y, bb.Min.y + style.FramePadding.y), text_col, ImGuiDir_Down, 1.0f);
    }
    RenderFrameBorder(bb.Min, bb.Max, style.FrameRounding);

    // Render preview and label
    if (preview_value != NULL && !(flags & ImGuiComboFlags_NoPreview))
    {
        if (g.LogEnabled)
            LogSetNextTextDecoration("{", "}");
        RenderTextClipped(bb.Min + style.FramePadding, ImVec2(value_x2, bb.Max.y), preview_value, NULL, NULL);
    }
    if (label_size.x > 0)
        RenderText(ImVec2(bb.Max.x + style.ItemInnerSpacing.x, bb.Min.y + style.FramePadding.y), label);

    if (!popup_open)
        return false;

    g.NextWindowData.Flags = backup_next_window_data_flags;
    return BeginComboPopup(popup_id, bb, flags);
}